

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 __thiscall ActionPrototypeTypes::apply(ActionPrototypeTypes *this,Funcdata *data)

{
  PcodeOp *pPVar1;
  uint uVar2;
  bool bVar3;
  int4 iVar4;
  int iVar5;
  type_metatype tVar6;
  uint4 uVar7;
  Architecture *pAVar8;
  FuncProto *pFVar9;
  undefined4 extraout_var;
  reference ppPVar10;
  Varnode *pVVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BlockGraph *pBVar12;
  Datatype *this_00;
  uint4 local_194;
  Datatype *ct;
  Varnode *local_110;
  Varnode *vn_1;
  ProtoParameter *param;
  BlockBasic *pBStack_f8;
  int4 numparams;
  BlockBasic *topbl_1;
  undefined1 local_e8 [4];
  int4 ptr_size;
  Address local_d8;
  PcodeOp *local_c8;
  PcodeOp *extop;
  Varnode *local_b0;
  Varnode *invn;
  VarnodeData *truncReg;
  VarnodeData *fullReg;
  BlockBasic *pBStack_90;
  int4 i_1;
  BlockBasic *topbl;
  AddrSpace *stackspc;
  AddrSpace *spc;
  _List_node_base *local_68;
  ProtoParameter *local_60;
  ProtoParameter *outparam;
  _List_node_base *local_50;
  ProtoModel *local_48;
  ProtoModel *evalfp;
  const_iterator iterend;
  const_iterator iter;
  Varnode *vn;
  PcodeOp *op;
  int4 i;
  Funcdata *data_local;
  ActionPrototypeTypes *this_local;
  
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iterend);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator
            ((_List_const_iterator<PcodeOp_*> *)&evalfp);
  pAVar8 = Funcdata::getArch(data);
  local_48 = pAVar8->evalfp_current;
  if (local_48 == (ProtoModel *)0x0) {
    pAVar8 = Funcdata::getArch(data);
    local_48 = pAVar8->defaultfp;
  }
  pFVar9 = Funcdata::getFuncProto(data);
  bVar3 = FuncProto::isModelLocked(pFVar9);
  if (!bVar3) {
    pFVar9 = Funcdata::getFuncProto(data);
    bVar3 = FuncProto::hasMatchingModel(pFVar9,local_48);
    if (!bVar3) {
      pFVar9 = Funcdata::getFuncProto(data);
      FuncProto::setModel(pFVar9,local_48);
    }
  }
  local_50 = (_List_node_base *)Funcdata::endOp(data,CPUI_RETURN);
  evalfp = (ProtoModel *)local_50;
  outparam = (ProtoParameter *)Funcdata::beginOp(data,CPUI_RETURN);
  iterend = (const_iterator)outparam;
  while (bVar3 = std::operator!=(&iterend,(_Self *)&evalfp), bVar3) {
    ppPVar10 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
    pPVar1 = *ppPVar10;
    bVar3 = PcodeOp::isDead(pPVar1);
    if (!bVar3) {
      pVVar11 = PcodeOp::getIn(pPVar1,0);
      bVar3 = Varnode::isConstant(pVVar11);
      if (!bVar3) {
        pVVar11 = PcodeOp::getIn(pPVar1,0);
        iVar4 = Varnode::getSize(pVVar11);
        pVVar11 = Funcdata::newConstant(data,iVar4,0);
        Funcdata::opSetInput(data,pPVar1,pVVar11,0);
      }
    }
    std::_List_const_iterator<PcodeOp_*>::operator++(&iterend);
  }
  pFVar9 = Funcdata::getFuncProto(data);
  bVar3 = FuncProto::isOutputLocked(pFVar9);
  if (bVar3) {
    pFVar9 = Funcdata::getFuncProto(data);
    local_60 = FuncProto::getOutput(pFVar9);
    iVar5 = (*local_60->_vptr_ProtoParameter[3])();
    tVar6 = Datatype::getMetatype((Datatype *)CONCAT44(extraout_var,iVar5));
    if (tVar6 != TYPE_VOID) {
      local_68 = (_List_node_base *)Funcdata::beginOp(data,CPUI_RETURN);
      iterend = (const_iterator)local_68;
      while (bVar3 = std::operator!=(&iterend,(_Self *)&evalfp), bVar3) {
        ppPVar10 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
        pPVar1 = *ppPVar10;
        bVar3 = PcodeOp::isDead(pPVar1);
        if ((!bVar3) && (uVar7 = PcodeOp::getHaltType(pPVar1), uVar7 == 0)) {
          iVar5 = (*local_60->_vptr_ProtoParameter[5])();
          (*local_60->_vptr_ProtoParameter[4])(&spc);
          pVVar11 = Funcdata::newVarnode(data,iVar5,(Address *)&spc,(Datatype *)0x0);
          iVar4 = PcodeOp::numInput(pPVar1);
          Funcdata::opInsertInput(data,pPVar1,pVVar11,iVar4);
          iVar5 = (*local_60->_vptr_ProtoParameter[3])();
          Varnode::updateType(pVVar11,(Datatype *)CONCAT44(extraout_var_00,iVar5),true,true);
        }
        std::_List_const_iterator<PcodeOp_*>::operator++(&iterend);
      }
    }
  }
  else {
    Funcdata::initActiveOutput(data);
  }
  pAVar8 = Funcdata::getArch(data);
  stackspc = AddrSpaceManager::getDefaultSpace(&pAVar8->super_AddrSpaceManager);
  bVar3 = AddrSpace::isTruncated(stackspc);
  if (bVar3) {
    pAVar8 = Funcdata::getArch(data);
    topbl = (BlockBasic *)AddrSpaceManager::getStackSpace(&pAVar8->super_AddrSpaceManager);
    pBStack_90 = (BlockBasic *)0x0;
    pBVar12 = Funcdata::getBasicBlocks(data);
    iVar4 = BlockGraph::getSize(pBVar12);
    if (0 < iVar4) {
      pBVar12 = Funcdata::getBasicBlocks(data);
      pBStack_90 = (BlockBasic *)BlockGraph::getBlock(pBVar12,0);
    }
    if ((topbl != (BlockBasic *)0x0) && (pBStack_90 != (BlockBasic *)0x0)) {
      for (fullReg._4_4_ = 0; uVar2 = fullReg._4_4_,
          iVar5 = (*(topbl->super_FlowBlock)._vptr_FlowBlock[2])(), (int)uVar2 < iVar5;
          fullReg._4_4_ = fullReg._4_4_ + 1) {
        iVar5 = (*(topbl->super_FlowBlock)._vptr_FlowBlock[4])(topbl,(ulong)fullReg._4_4_);
        truncReg = (VarnodeData *)CONCAT44(extraout_var_01,iVar5);
        iVar5 = (*(topbl->super_FlowBlock)._vptr_FlowBlock[3])(topbl,(ulong)fullReg._4_4_);
        invn = (Varnode *)CONCAT44(extraout_var_02,iVar5);
        iVar4 = *(int4 *)&(invn->loc).base;
        VarnodeData::getAddr((VarnodeData *)&extop);
        local_b0 = Funcdata::newVarnode(data,iVar4,(Address *)&extop,(Datatype *)0x0);
        local_b0 = Funcdata::setInputVarnode(data,local_b0);
        (*(pBStack_90->super_FlowBlock)._vptr_FlowBlock[2])(&local_d8);
        local_c8 = Funcdata::newOp(data,1,&local_d8);
        uVar7 = truncReg->size;
        VarnodeData::getAddr((VarnodeData *)local_e8);
        Funcdata::newVarnodeOut(data,uVar7,(Address *)local_e8,local_c8);
        Funcdata::opSetOpcode(data,local_c8,CPUI_INT_ZEXT);
        Funcdata::opSetInput(data,local_c8,local_b0,0);
        Funcdata::opInsertBegin(data,local_c8,pBStack_90);
      }
    }
  }
  pFVar9 = Funcdata::getFuncProto(data);
  bVar3 = FuncProto::isInputLocked(pFVar9);
  if (bVar3) {
    bVar3 = AddrSpace::isTruncated(stackspc);
    if (bVar3) {
      local_194 = AddrSpace::getAddrSize(stackspc);
    }
    else {
      local_194 = 0;
    }
    topbl_1._4_4_ = local_194;
    pBStack_f8 = (BlockBasic *)0x0;
    pBVar12 = Funcdata::getBasicBlocks(data);
    iVar4 = BlockGraph::getSize(pBVar12);
    if (0 < iVar4) {
      pBVar12 = Funcdata::getBasicBlocks(data);
      pBStack_f8 = (BlockBasic *)BlockGraph::getBlock(pBVar12,0);
    }
    pFVar9 = Funcdata::getFuncProto(data);
    param._4_4_ = FuncProto::numParams(pFVar9);
    for (op._4_4_ = 0; op._4_4_ < param._4_4_; op._4_4_ = op._4_4_ + 1) {
      pFVar9 = Funcdata::getFuncProto(data);
      vn_1 = (Varnode *)FuncProto::getParam(pFVar9,op._4_4_);
      iVar5 = (*(*(_func_int ***)vn_1)[5])();
      (**(code **)(*(long *)vn_1 + 0x20))(&ct);
      local_110 = Funcdata::newVarnode(data,iVar5,(Address *)&ct,(Datatype *)0x0);
      local_110 = Funcdata::setInputVarnode(data,local_110);
      if (pBStack_f8 != (BlockBasic *)0x0) {
        extendInput(this,data,local_110,(ProtoParameter *)vn_1,pBStack_f8);
      }
      if (0 < (int)topbl_1._4_4_) {
        this_00 = (Datatype *)(**(code **)(*(long *)vn_1 + 0x18))();
        tVar6 = Datatype::getMetatype(this_00);
        if ((tVar6 == TYPE_PTR) && (uVar7 = Datatype::getSize(this_00), uVar7 == topbl_1._4_4_)) {
          Varnode::setPtrFlow(local_110);
        }
      }
    }
  }
  return 0;
}

Assistant:

int4 ActionPrototypeTypes::apply(Funcdata &data)

{
  int4 i;
  PcodeOp *op;
  Varnode *vn;
  list<PcodeOp *>::const_iterator iter,iterend;

  // Set the evalutation prototype if we are not already locked
  ProtoModel *evalfp = data.getArch()->evalfp_current;
  if (evalfp == (ProtoModel *)0)
    evalfp = data.getArch()->defaultfp;
  if ((!data.getFuncProto().isModelLocked())&&(!data.getFuncProto().hasMatchingModel(evalfp)))
    data.getFuncProto().setModel(evalfp);

  iterend = data.endOp(CPUI_RETURN);

				// Strip the indirect register from all RETURN ops
				// (Because we don't want to see this compiler
				// mechanism in the high-level C output)
  for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
    op = *iter;
    if (op->isDead()) continue;
    if (!op->getIn(0)->isConstant()) {
      vn = data.newConstant(op->getIn(0)->getSize(),0);
      data.opSetInput(op,vn,0);
    }
  }
  
  if (data.getFuncProto().isOutputLocked()) {
    ProtoParameter *outparam = data.getFuncProto().getOutput();
    if (outparam->getType()->getMetatype() != TYPE_VOID) {
      for(iter=data.beginOp(CPUI_RETURN);iter!=iterend;++iter) {
	op = *iter;
	if (op->isDead()) continue;
	if (op->getHaltType() != 0) continue;
	vn = data.newVarnode(outparam->getSize(),outparam->getAddress());
	data.opInsertInput(op,vn,op->numInput());
	vn->updateType(outparam->getType(),true,true);
      }
    }
  }
  else
    data.initActiveOutput(); // Initiate gathering potential return values

  AddrSpace *spc = data.getArch()->getDefaultSpace();
  if (spc->isTruncated()) {
    // For truncated spaces we need a zext op, from the truncated stack pointer
    // into the full stack pointer
    AddrSpace *stackspc = data.getArch()->getStackSpace();
    BlockBasic *topbl = (BlockBasic *)0;
    if (data.getBasicBlocks().getSize() > 0)
      topbl = (BlockBasic *)data.getBasicBlocks().getBlock(0);
    if ((stackspc != (AddrSpace *)0)&&(topbl != (BlockBasic *)0)) {
      for(int4 i=0;i<stackspc->numSpacebase();++i) {
	const VarnodeData &fullReg( stackspc->getSpacebaseFull(i) );
	const VarnodeData &truncReg( stackspc->getSpacebase(i) );
	Varnode *invn = data.newVarnode( truncReg.size, truncReg.getAddr() );
	invn = data.setInputVarnode(invn);
	PcodeOp *extop = data.newOp(1,topbl->getStart());
	data.newVarnodeOut(fullReg.size,fullReg.getAddr(),extop);
	data.opSetOpcode(extop,CPUI_INT_ZEXT);
	data.opSetInput(extop,invn,0);
	data.opInsertBegin(extop,topbl);
      }
    }
  }

  // Force locked inputs to exist as varnodes

  // This is needed if we want to force a big input to exist
  // but only part of it is getting used. This is allows
  // a SUBPIECE instruction to get built with the big variable
  // as input and the part getting used as output.
  if (data.getFuncProto().isInputLocked()) {

    int4 ptr_size = spc->isTruncated() ? spc->getAddrSize() : 0; // Check if we need to do pointer trimming
    BlockBasic *topbl = (BlockBasic *)0;
    if (data.getBasicBlocks().getSize() > 0)
      topbl = (BlockBasic *)data.getBasicBlocks().getBlock(0);
    
    int4 numparams = data.getFuncProto().numParams();
    for(i=0;i<numparams;++i) {
      ProtoParameter *param = data.getFuncProto().getParam(i);
      Varnode *vn = data.newVarnode( param->getSize(), param->getAddress());
      vn = data.setInputVarnode(vn);
      if (topbl != (BlockBasic *)0)
	extendInput(data,vn,param,topbl);
      if (ptr_size > 0) {
	Datatype *ct = param->getType();
	if ((ct->getMetatype() == TYPE_PTR)&&(ct->getSize() == ptr_size))
	  vn->setPtrFlow();
      }
    }
  }
  return 0;
}